

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

bool __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBestInit(TaggerImpl *this,char *str,size_t len)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  Lattice *pLVar4;
  undefined4 extraout_var;
  
  pLVar4 = mutable_lattice(this);
  (*pLVar4->_vptr_Lattice[10])(pLVar4,str,len);
  initRequestType(this);
  (*pLVar4->_vptr_Lattice[0x14])(pLVar4,2);
  iVar2 = (**(this->super_Tagger)._vptr_Tagger)(this);
  if (SUB41(iVar2,0) == false) {
    iVar3 = (*pLVar4->_vptr_Lattice[0x24])(pLVar4);
    pcVar1 = (char *)(this->what_)._M_string_length;
    strlen((char *)CONCAT44(extraout_var,iVar3));
    std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar1,CONCAT44(extraout_var,iVar3));
  }
  return SUB41(iVar2,0);
}

Assistant:

bool TaggerImpl::parseNBestInit(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);
  if (!parse(lattice)) {
    set_what(lattice->what());
    return false;
  }
  return true;
}